

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O3

UnicodeType
duckdb::Utf8Proc::Analyze
          (char *s,size_t len,UnicodeInvalidReason *invalid_reason,size_t *invalid_pos)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  UnicodeType UVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  long lVar12;
  ulong uVar8;
  
  if (len == 0) {
    return ASCII;
  }
  UVar4 = ASCII;
  uVar10 = 0;
LAB_01852ea1:
  do {
    uVar7 = uVar10;
    if (uVar7 + 8 <= len) {
      uVar10 = uVar7 + 8;
      if ((*(ulong *)(s + uVar7) & 0x8080808080808080) == 0) goto LAB_01852ea1;
    }
    uVar10 = uVar7 + 8;
    if (len <= uVar7 + 8) {
      uVar10 = len;
    }
    while (uVar7 < uVar10) {
      bVar1 = s[uVar7];
      uVar8 = uVar7;
      if ((char)bVar1 < '\0') {
        uVar6 = (uint)bVar1;
        if ((bVar1 & 0xffffffe0) == 0xc0) {
          if (len - uVar7 < 2) {
LAB_0185304d:
            if (invalid_reason != (UnicodeInvalidReason *)0x0) {
              *invalid_reason = BYTE_MISMATCH;
            }
            goto LAB_01853058;
          }
          uVar9 = uVar7 + 1;
          if (invalid_reason != (UnicodeInvalidReason *)0x0) {
            *invalid_reason = BYTE_MISMATCH;
          }
          goto LAB_01853033;
        }
        uVar9 = uVar7;
        if ((uVar6 & 0xfffffff0) == 0xe0) {
          if (len - uVar7 < 3) goto LAB_0185304d;
          uVar8 = uVar7 + 2;
          uVar6 = bVar1 & 0xf;
          bVar3 = true;
          do {
            bVar11 = bVar3;
            uVar5 = uVar6;
            uVar9 = uVar9 + 1;
            if (((byte)s[uVar9] & 0xffffffc0) != 0x80) goto LAB_01853025;
            uVar6 = (byte)s[uVar9] & 0x3f | uVar5 << 6;
            bVar3 = false;
          } while (bVar11);
          uVar2 = uVar5 & 0x3e0;
        }
        else {
          if ((uVar6 & 0xfffffff8) != 0xf0) {
            if (invalid_reason != (UnicodeInvalidReason *)0x0) {
              *invalid_reason = BYTE_MISMATCH;
            }
            goto LAB_01853033;
          }
          if (len - uVar7 < 4) goto LAB_0185304d;
          uVar8 = uVar7 + 3;
          lVar12 = 3;
          uVar6 = uVar6 & 7;
          do {
            uVar5 = uVar6;
            uVar9 = uVar9 + 1;
            if (((byte)s[uVar9] & 0xffffffc0) != 0x80) goto LAB_01853025;
            uVar6 = (byte)s[uVar9] & 0x3f | uVar5 << 6;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          uVar2 = uVar5 & 0x7c00;
        }
        if (((uVar2 != 0) && ((int)uVar6 < 0x110000)) &&
           (UVar4 = UNICODE, (uVar5 & 0x7ffe0) != 0x360)) goto LAB_01853006;
        if (invalid_reason != (UnicodeInvalidReason *)0x0) {
          *invalid_reason = INVALID_UNICODE;
        }
LAB_01853058:
        if (invalid_pos == (size_t *)0x0) {
          return INVALID;
        }
        uVar9 = (ulong)(int)uVar7;
        goto LAB_01853060;
      }
LAB_01853006:
      uVar7 = uVar8 + 1;
    }
    uVar10 = uVar7;
    if (len <= uVar7) {
      return UVar4;
    }
  } while( true );
LAB_01853025:
  if (invalid_reason != (UnicodeInvalidReason *)0x0) {
    *invalid_reason = BYTE_MISMATCH;
  }
LAB_01853033:
  if (invalid_pos != (size_t *)0x0) {
LAB_01853060:
    *invalid_pos = uVar9;
  }
  return INVALID;
}

Assistant:

UnicodeType Utf8Proc::Analyze(const char *s, size_t len, UnicodeInvalidReason *invalid_reason, size_t *invalid_pos) {
	UnicodeType type = UnicodeType::ASCII;

	static constexpr uint64_t MASK = 0x8080808080808080U;
	for (size_t i = 0; i < len;) {
		// Check 8 bytes at a time until we hit non-ASCII
		for (; i + sizeof(uint64_t) <= len; i += sizeof(uint64_t)) {
			if (Load<uint64_t>(const_data_ptr_cast(s + i)) & MASK) {
				break; // Non-ASCII in the next 8 bytes
			}
		}
		// Check 1 byte at a time for the next 8 bytes
		const auto end = MinValue(i + sizeof(uint64_t), len);
		for (; i < end; i++) {
			int c = (int)s[i];
			if ((c & 0x80) == 0) {
				continue;
			}
			int first_pos_seq = i;

			if ((c & 0xE0) == 0xC0) {
				/* 2 byte sequence */
				int utf8char = c & 0x1F;
				type = UTF8ExtraByteLoop<1, 0x000780>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else if ((c & 0xF0) == 0xE0) {
				/* 3 byte sequence */
				int utf8char = c & 0x0F;
				type = UTF8ExtraByteLoop<2, 0x00F800>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else if ((c & 0xF8) == 0xF0) {
				/* 4 byte sequence */
				int utf8char = c & 0x07;
				type = UTF8ExtraByteLoop<3, 0x1F0000>(first_pos_seq, utf8char, i, s, len, invalid_reason, invalid_pos);
			} else {
				/* invalid UTF-8 start byte */
				AssignInvalidUTF8Reason(invalid_reason, invalid_pos, i, UnicodeInvalidReason::BYTE_MISMATCH);
				return UnicodeType::INVALID;
			}
			if (type == UnicodeType::INVALID) {
				return type;
			}
		}
	}
	return type;
}